

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O1

string * convert_pub_filename(string *__return_storage_ptr__,string *s)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar3 = (s->_M_dataplus)._M_p;
  cVar2 = *pcVar3;
  while (cVar2 != '\0') {
    if ((((cVar2 == '0') &&
         ((ulong)((long)pcVar3 - (long)(s->_M_dataplus)._M_p) < s->_M_string_length - 3)) &&
        (pcVar3[1] == '0')) && (pcVar3[2] == '1')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar3 = pcVar3 + 2;
    }
    else {
      if (cVar2 == '%') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pcVar1 = pcVar3 + 1;
    pcVar3 = pcVar3 + 1;
    cVar2 = *pcVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convert_pub_filename(const std::string& s)
{
	std::string result;

	for (const char* p = &s[0]; *p != '\0'; ++p)
	{
		if ((p - &s[0]) < s.size() - 3 && p[0] == '0' && p[1] == '0' && p[2] == '1')
		{
			result += "%03d";
			p += 2;
			continue;
		}

		if (*p == '%')
			result += '%';

		result += *p;
	}

	return result;
}